

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  time_t tVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  byte bVar6;
  uchar local_31;
  
  tVar2 = time((time_t *)0x0);
  srandom((uint)tVar2);
  memset(&greatest_info,0,0x170);
  greatest_info.width = 0x48;
  greatest_info.begin = clock();
  if (greatest_info.begin == -1) {
    pcVar3 = "greatest_info.begin";
LAB_00107093:
    fprintf(_stdout,"clock error: %s\n",pcVar3);
LAB_00107061:
    exit(1);
  }
  if (1 < argc) {
    local_31 = greatest_info.verbosity;
    iVar5 = 1;
    bVar6 = greatest_info.flags;
    do {
      pcVar3 = argv[iVar5];
      iVar1 = strncmp("-t",pcVar3,2);
      if (iVar1 == 0) {
        iVar5 = iVar5 + 1;
        if (argc <= iVar5) {
LAB_00107059:
          greatest_usage(*argv);
          goto LAB_00107061;
        }
        greatest_info.test_filter = argv[iVar5];
      }
      else {
        iVar1 = strncmp("-s",pcVar3,2);
        if (iVar1 == 0) {
          iVar5 = iVar5 + 1;
          if (argc <= iVar5) goto LAB_00107059;
          greatest_info.suite_filter = argv[iVar5];
        }
        else {
          iVar1 = strncmp("-f",pcVar3,2);
          if (iVar1 == 0) {
            bVar6 = bVar6 | 1;
            greatest_info.flags = bVar6;
          }
          else {
            iVar1 = strncmp("-v",pcVar3,2);
            if (iVar1 == 0) {
              greatest_info.verbosity = local_31 + '\x01';
              local_31 = greatest_info.verbosity;
            }
            else {
              iVar1 = strncmp("-l",pcVar3,2);
              if (iVar1 != 0) {
                iVar5 = strncmp("-h",pcVar3,2);
                if ((iVar5 == 0) || (iVar5 = strncmp("--help",pcVar3,6), iVar5 == 0)) {
                  greatest_usage(*argv);
                  exit(0);
                }
                iVar5 = strncmp("--",pcVar3,2);
                if (iVar5 != 0) {
                  fprintf(_stdout,"Unknown argument \'%s\'\n",pcVar3);
                  goto LAB_00107059;
                }
                break;
              }
              bVar6 = bVar6 | 2;
              greatest_info.flags = bVar6;
            }
          }
        }
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < argc);
  }
  greatest_run_suite(generic_pack_unpack_le,"generic_pack_unpack_le");
  greatest_run_suite(generic_pack_unpack_be,"generic_pack_unpack_be");
  greatest_run_suite(generic_mixed_endian,"generic_mixed_endian");
  greatest_run_suite(plan,"plan");
  if ((greatest_info.flags & 2) == 0) {
    greatest_info.teardown = (undefined1 *)0x0;
    greatest_info.teardown_udata = (void *)0x0;
    greatest_info.setup = (undefined1 *)0x0;
    greatest_info.setup_udata = (void *)0x0;
    greatest_info.passed = greatest_info.passed + greatest_info.suite.passed;
    greatest_info.failed = greatest_info.failed + greatest_info.suite.failed;
    greatest_info.skipped = greatest_info.skipped + greatest_info.suite.skipped;
    greatest_info.tests_run = greatest_info.tests_run + greatest_info.suite.tests_run;
    greatest_info.suite.tests_run = 0;
    greatest_info.suite.passed = 0;
    greatest_info.suite.failed = 0;
    greatest_info.suite.skipped = 0;
    greatest_info.suite.pre_suite = 0;
    greatest_info.suite.post_suite = 0;
    greatest_info.suite.pre_test = 0;
    greatest_info.suite.post_test = 0;
    greatest_info.col = 0;
    greatest_info.end = clock();
    if (greatest_info.end == -1) {
      pcVar3 = "greatest_info.end";
      greatest_info.end = -1;
      goto LAB_00107093;
    }
    pcVar4 = "s";
    pcVar3 = "s";
    if (greatest_info.tests_run == 1) {
      pcVar3 = "";
    }
    fprintf(_stdout,"\nTotal: %u test%s",(ulong)greatest_info.tests_run,pcVar3);
    fprintf(_stdout," (%lu ticks, %.3f sec)",
            SUB84((double)(greatest_info.end - greatest_info.begin) / 1000000.0,0));
    if (greatest_info.assertions == 1) {
      pcVar4 = "";
    }
    fprintf(_stdout,", %u assertion%s\n",(ulong)greatest_info.assertions,pcVar4);
    fprintf(_stdout,"Pass: %u, fail: %u, skip: %u.\n",(ulong)greatest_info.passed,
            (ulong)greatest_info.failed,(ulong)greatest_info.skipped);
  }
  return (int)(greatest_info.failed != 0);
}

Assistant:

int
main(int argc, char ** argv) {
    srandom(time(NULL));
    GREATEST_MAIN_BEGIN();
    RUN_SUITE(generic_pack_unpack_le);
    RUN_SUITE(generic_pack_unpack_be);
    RUN_SUITE(generic_mixed_endian);
    RUN_SUITE(plan);
    GREATEST_MAIN_END();
}